

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

char * re2::TerminateNumber(char *buf,int nbuf,char *str,int *np,bool accept_spaces)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char cVar6;
  ulong __n;
  
  iVar3 = *np;
  if (iVar3 < 1) {
    return "";
  }
  cVar6 = *str;
  iVar2 = isspace((int)cVar6);
  if (iVar2 == 0) {
LAB_0011aa62:
    pcVar5 = str + (uint)(cVar6 == '-');
    uVar4 = iVar3 - (uint)(cVar6 == '-');
    if (((2 < uVar4) && (*pcVar5 == '0')) && (pcVar5[1] == '0')) {
      do {
        if (pcVar5[2] != '0') goto LAB_0011aa99;
        pcVar5 = pcVar5 + 1;
        bVar1 = 3 < (int)uVar4;
        uVar4 = uVar4 - 1;
      } while (bVar1);
      uVar4 = 2;
    }
LAB_0011aa99:
    uVar4 = (cVar6 == '-') + uVar4;
    if (nbuf <= (int)uVar4) {
      return "";
    }
    __n = (ulong)uVar4;
    memmove(buf,pcVar5 + -(ulong)(cVar6 == '-'),__n);
    if (cVar6 == '-') {
      *buf = '-';
    }
  }
  else {
    if (!accept_spaces) {
      return "";
    }
    do {
      cVar6 = *str;
      iVar2 = isspace((int)cVar6);
      if (iVar2 == 0) goto LAB_0011aa62;
      str = str + 1;
      bVar1 = 1 < iVar3;
      iVar3 = iVar3 + -1;
    } while (bVar1);
    if (nbuf < 1) {
      return "";
    }
    __n = 0;
    uVar4 = 0;
  }
  buf[__n] = '\0';
  *np = uVar4;
  return buf;
}

Assistant:

static const char* TerminateNumber(char* buf, int nbuf, const char* str, int* np,
                                   bool accept_spaces) {
  int n = *np;
  if (n <= 0) return "";
  if (n > 0 && isspace(*str)) {
    // We are less forgiving than the strtoxxx() routines and do not
    // allow leading spaces. We do allow leading spaces for floats.
    if (!accept_spaces) {
      return "";
    }
    while (n > 0 && isspace(*str)) {
      n--;
      str++;
    }
  }

  // Although buf has a fixed maximum size, we can still handle
  // arbitrarily large integers correctly by omitting leading zeros.
  // (Numbers that are still too long will be out of range.)
  // Before deciding whether str is too long,
  // remove leading zeros with s/000+/00/.
  // Leaving the leading two zeros in place means that
  // we don't change 0000x123 (invalid) into 0x123 (valid).
  // Skip over leading - before replacing.
  bool neg = false;
  if (n >= 1 && str[0] == '-') {
    neg = true;
    n--;
    str++;
  }

  if (n >= 3 && str[0] == '0' && str[1] == '0') {
    while (n >= 3 && str[2] == '0') {
      n--;
      str++;
    }
  }

  if (neg) {  // make room in buf for -
    n++;
    str--;
  }

  if (n > nbuf-1) return "";

  memmove(buf, str, n);
  if (neg) {
    buf[0] = '-';
  }
  buf[n] = '\0';
  *np = n;
  return buf;
}